

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O3

ON_Curve * ON_TrimCurve(ON_Curve *curve,ON_Interval trim_parameters)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  ON_Object *p;
  ON_Object *p_00;
  ON_PolyCurve *this;
  ON_PolyCurve *this_00;
  ON_Curve *c;
  undefined4 extraout_var_01;
  _func_int **pp_Var5;
  double dVar6;
  double dVar7;
  ON_Interval curve_domain;
  ON_Interval sdom;
  ON_Interval local_70;
  double local_60;
  double local_58;
  ON_Interval local_50;
  ON_Interval local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  dVar7 = trim_parameters.m_t[1];
  local_70.m_t[0] = trim_parameters.m_t[0];
  local_70.m_t[1] = dVar7;
  (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  local_50.m_t[1] = dVar7;
  bVar1 = ON_Interval::IsDecreasing(&local_70);
  ON_Interval::Intersection(&local_70,&local_50);
  if (bVar1) {
    ON_Interval::Swap(&local_70);
    pdVar4 = ON_Interval::operator[](&local_70,0);
    dVar7 = *pdVar4;
    iVar2 = 1;
    local_60 = ON_Interval::operator[](&local_50,1);
    pdVar4 = ON_Interval::operator[](&local_70,1);
    local_58 = *pdVar4;
    dVar6 = ON_Interval::operator[](&local_50,0);
    if ((dVar7 != local_60) || (NAN(dVar7) || NAN(local_60))) {
      if ((local_58 != dVar6) || (NAN(local_58) || NAN(dVar6))) {
        bVar1 = ON_Interval::IsDecreasing(&local_70);
        if (!bVar1) {
          return (ON_Curve *)0x0;
        }
        goto LAB_00427f0c;
      }
    }
    else {
      if ((local_58 == dVar6) && (!NAN(local_58) && !NAN(dVar6))) {
        return (ON_Curve *)0x0;
      }
      iVar2 = 0;
    }
    dVar7 = ON_Interval::operator[](&local_50,iVar2);
    pdVar4 = ON_Interval::operator[](&local_70,iVar2);
    *pdVar4 = dVar7;
  }
LAB_00427f0c:
  bVar1 = ON_Interval::IsDecreasing(&local_70);
  if ((bVar1) &&
     (iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(curve),
     (char)iVar2 != '\0')) {
    iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
    p = (ON_Object *)CONCAT44(extraout_var,iVar2);
    pdVar4 = ON_Interval::operator[](&local_70,0);
    dVar7 = *pdVar4;
    dVar6 = ON_Interval::operator[](&local_50,1);
    ON_Interval::ON_Interval(&local_40,dVar7,dVar6);
    iVar2 = (*p->_vptr_ON_Object[0x3c])(p);
    if ((char)iVar2 == '\0') {
      pp_Var5 = p->_vptr_ON_Object;
    }
    else {
      iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
      p_00 = (ON_Object *)CONCAT44(extraout_var_00,iVar2);
      dVar7 = ON_Interval::operator[](&local_50,0);
      pdVar4 = ON_Interval::operator[](&local_70,1);
      ON_Interval::ON_Interval(&local_40,dVar7,*pdVar4);
      iVar2 = (*p_00->_vptr_ON_Object[0x3c])(p_00);
      if ((char)iVar2 != '\0') {
        this = ON_PolyCurve::Cast(p);
        if (this == (ON_PolyCurve *)0x0) {
          this = (ON_PolyCurve *)operator_new(0x40);
          ON_PolyCurve::ON_PolyCurve(this);
          ON_PolyCurve::Append(this,(ON_Curve *)p);
        }
        this_00 = ON_PolyCurve::Cast(p_00);
        if (this_00 == (ON_PolyCurve *)0x0) {
          ON_PolyCurve::Append(this,(ON_Curve *)p_00);
        }
        else {
          iVar2 = ON_PolyCurve::Count(this_00);
          if (0 < iVar2) {
            iVar2 = 0;
            do {
              local_40 = ON_PolyCurve::SegmentDomain(this_00,iVar2);
              c = ON_PolyCurve::HarvestSegment(this_00,iVar2);
              pdVar4 = ON_Interval::operator[](&local_40,0);
              dVar7 = *pdVar4;
              pdVar4 = ON_Interval::operator[](&local_40,1);
              (*(c->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(dVar7,*pdVar4,c);
              ON_PolyCurve::Append(this,c);
              iVar2 = iVar2 + 1;
              iVar3 = ON_PolyCurve::Count(this_00);
            } while (iVar2 < iVar3);
          }
          (*p_00->_vptr_ON_Object[4])(p_00);
        }
        pdVar4 = ON_Interval::operator[](&local_70,0);
        dVar7 = *pdVar4;
        pdVar4 = ON_Interval::operator[](&local_70,1);
        local_60 = *pdVar4;
        dVar6 = ON_Interval::Length(&local_50);
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (dVar7,local_60 + dVar6,this);
        return &this->super_ON_Curve;
      }
      (*p->_vptr_ON_Object[4])(p);
      pp_Var5 = p_00->_vptr_ON_Object;
      p = p_00;
    }
  }
  else {
    bVar1 = ON_Interval::IsIncreasing(&local_70);
    if (!bVar1) {
      return (ON_Curve *)0x0;
    }
    iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
    p = (ON_Object *)CONCAT44(extraout_var_01,iVar2);
    if (p == (ON_Object *)0x0) {
      return (ON_Curve *)0x0;
    }
    iVar2 = (*p->_vptr_ON_Object[0x3c])(p,&local_70);
    if ((char)iVar2 != '\0') {
      return (ON_Curve *)p;
    }
    pp_Var5 = p->_vptr_ON_Object;
  }
  (*pp_Var5[4])(p);
  return (ON_Curve *)0x0;
}

Assistant:

ON_Curve* ON_TrimCurve( 
            const ON_Curve& curve,
            ON_Interval trim_parameters
            )
{
  ON_Curve* trimmed_curve = 0;

  const ON_Interval curve_domain = curve.Domain();
  bool bDecreasing = trim_parameters.IsDecreasing();
  trim_parameters.Intersection( curve_domain ); // trim_parameters will be increasing or empty
  if ( bDecreasing )
  {
    trim_parameters.Swap();
    if ( trim_parameters[0] == curve_domain[1] )
    {
      if ( trim_parameters[1] == curve_domain[0] )
        return 0;
      trim_parameters[0] = curve_domain[0];
    }
    else if ( trim_parameters[1] == curve_domain[0] )
      trim_parameters[1] = curve_domain[1];
    else if ( !trim_parameters.IsDecreasing() )
      return 0;
  }

  if ( trim_parameters.IsDecreasing() && curve.IsClosed() )
  {
    ON_Curve* left_crv = curve.DuplicateCurve();
    if ( !left_crv->Trim(ON_Interval(trim_parameters[0],curve_domain[1])) )
    {
      delete left_crv;
      return 0;
    }
    ON_Curve* right_crv = curve.DuplicateCurve();
    if ( !right_crv->Trim(ON_Interval(curve_domain[0],trim_parameters[1])) )
    {
      delete left_crv;
      delete right_crv;
      return 0;
    }
    ON_PolyCurve* polycurve = ON_PolyCurve::Cast(left_crv);
    if ( polycurve == nullptr )
    {
      polycurve = new ON_PolyCurve();      
      polycurve->Append( left_crv );
    }

    ON_PolyCurve* ptmp = ON_PolyCurve::Cast(right_crv);
    if ( ptmp )
    {
      int i;
      for ( i = 0; i < ptmp->Count(); i++ )
      {
        ON_Interval sdom = ptmp->SegmentDomain(i);
        ON_Curve* segment = ptmp->HarvestSegment(i);
        segment->SetDomain(sdom[0],sdom[1]); // to keep relative parameterization unchanged
        polycurve->Append( segment );
      }
      delete right_crv;
      ptmp = 0;
      right_crv = 0;
    }
    else
    {
      polycurve->Append( right_crv );
    }

    polycurve->SetDomain( trim_parameters[0], trim_parameters[1] + curve_domain.Length() );

    trimmed_curve = polycurve;
  }
  else if ( trim_parameters.IsIncreasing() )
  {
    trimmed_curve = curve.DuplicateCurve();
    if(!trimmed_curve || !trimmed_curve->Trim(trim_parameters) )
    {
      delete trimmed_curve;
      trimmed_curve = 0;
    }
  }

  return trimmed_curve;
}